

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_shmtx.c
# Opt level: O1

ngx_uint_t ngx_shmtx_force_unlock(ngx_shmtx_t *mtx,ngx_pid_t pid)

{
  bool bVar1;
  
  if ((ngx_cycle->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"shmtx forced unlock");
  }
  LOCK();
  bVar1 = (long)pid == *mtx->lock;
  if (bVar1) {
    *mtx->lock = 0;
  }
  UNLOCK();
  return (ulong)bVar1;
}

Assistant:

ngx_uint_t
ngx_shmtx_force_unlock(ngx_shmtx_t *mtx, ngx_pid_t pid)
{
    ngx_log_debug0(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0,
                   "shmtx forced unlock");

    if (ngx_atomic_cmp_set(mtx->lock, pid, 0)) {
        ngx_shmtx_wakeup(mtx);
        return 1;
    }

    return 0;
}